

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

int spill_el_cmp(spill_el_t *e1,spill_el_t *e2)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  bool bVar5;
  
  cVar1 = e1->edge_p;
  if (cVar1 != e2->edge_p) {
    return (int)cVar1 - (int)e2->edge_p;
  }
  if (cVar1 == '\0') {
LAB_00172d65:
    if ((e1->u).e != (e2->u).e) {
      bVar5 = ((e1->u).e)->src < ((e2->u).e)->src;
LAB_00172d78:
      return -(uint)bVar5 | 1;
    }
    if (cVar1 == '\0') {
      iVar2 = (int)e1->bb_end_p;
      iVar4 = (int)e2->bb_end_p;
      if (e1->bb_end_p != e2->bb_end_p) goto LAB_00172dbc;
    }
  }
  else {
    bVar5 = (e1->u).e < (e2->u).e;
    if ((e1->u).e != (e2->u).e) goto LAB_00172d78;
    if (cVar1 == '\0') goto LAB_00172d65;
  }
  iVar4 = (int)e1->spill_p;
  iVar2 = (int)e2->spill_p;
  if (e1->spill_p == e2->spill_p) {
    uVar3 = 0;
    if (e1->reg != e2->reg) {
      uVar3 = -(uint)(e1->reg < e2->reg) | 1;
    }
    return uVar3;
  }
  if ((cVar1 == '\0') && (e1->bb_end_p == '\0')) {
    return iVar4 - iVar2;
  }
LAB_00172dbc:
  return iVar2 - iVar4;
}

Assistant:

static int spill_el_cmp (const spill_el_t *e1, const spill_el_t *e2) {
  if (e1->edge_p != e2->edge_p) return e1->edge_p - e2->edge_p; /* put bb first */
  if (e1->edge_p && e1->u.e != e2->u.e) return e1->u.e < e2->u.e ? -1 : 1;
  if (!e1->edge_p && e1->u.bb != e2->u.bb) return e1->u.bb->index < e2->u.bb->index ? -1 : 1;
  if (!e1->edge_p && e1->bb_end_p != e2->bb_end_p)
    return e1->bb_end_p - e2->bb_end_p; /* start first */
  if (e1->spill_p != e2->spill_p)       /* load first for bb start, store first otherwise: */
    return !e1->edge_p && !e1->bb_end_p ? e1->spill_p - e2->spill_p : e2->spill_p - e1->spill_p;
  return e1->reg == e2->reg ? 0 : e1->reg < e2->reg ? -1 : 1; /* smaller reg first */
}